

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceVkImpl::CreateShader
          (RenderDeviceVkImpl *this,ShaderCreateInfo *ShaderCI,IShader **ppShader,
          IDataBlob **ppCompilerOutput)

{
  CreateInfo VkShaderCI;
  CreateInfo local_30;
  
  local_30.pDXCompiler =
       (this->m_pDxCompiler)._M_t.
       super___uniq_ptr_impl<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>.
       _M_t.
       super__Tuple_impl<0UL,_Diligent::IDXCompiler_*,_std::default_delete<Diligent::IDXCompiler>_>.
       super__Head_base<0UL,_Diligent::IDXCompiler_*,_false>._M_head_impl;
  local_30.DeviceInfo =
       &(this->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo;
  local_30.AdapterInfo =
       &(this->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo;
  local_30.VkVersion =
       ((this->m_PhysicalDevice)._M_t.
        super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
        ._M_t.
        super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
        .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl)->
       m_VkVersion;
  local_30.HasSpirv14 =
       (((this->m_LogicalVkDevice).
         super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->m_EnabledExtFeatures).Spirv14;
  local_30.pCompilationThreadPool =
       (this->
       super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
       ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_pShaderCompilationThreadPool.
       m_pObject;
  local_30.ppCompilerOutput = ppCompilerOutput;
  RenderDeviceBase<Diligent::EngineVkImplTraits>::
  CreateShaderImpl<Diligent::ShaderVkImpl::CreateInfo>
            ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this,ppShader,ShaderCI,&local_30);
  return;
}

Assistant:

void RenderDeviceVkImpl::CreateShader(const ShaderCreateInfo& ShaderCI,
                                      IShader**               ppShader,
                                      IDataBlob**             ppCompilerOutput)
{
    const ShaderVkImpl::CreateInfo VkShaderCI{
        GetDxCompiler(),
        GetDeviceInfo(),
        GetAdapterInfo(),
        GetVkVersion(),
        GetLogicalDevice().GetEnabledExtFeatures().Spirv14,
        ppCompilerOutput,
        m_pShaderCompilationThreadPool,
    };
    CreateShaderImpl(ppShader, ShaderCI, VkShaderCI);
}